

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O1

char * ctemplate::ExpandWithCacheIs
                 (TemplateCache *cache,string *filename,Strip strip,TemplateDictionary *dict,
                 PerExpandData *per_expand_data,bool expected)

{
  char *pcVar1;
  char cVar2;
  char *__dest;
  undefined4 in_register_00000014;
  string outstring;
  char *local_80;
  long local_78;
  char local_70 [16];
  undefined **local_60;
  char **local_58;
  pointer local_50;
  size_type local_48;
  undefined1 local_40;
  undefined8 local_38;
  
  local_80 = local_70;
  local_78 = 0;
  local_70[0] = '\0';
  local_50 = (filename->_M_dataplus)._M_p;
  local_48 = filename->_M_string_length;
  local_40 = 0;
  local_38 = 0;
  local_60 = &PTR__ExpandEmitter_0011dcf8;
  local_58 = &local_80;
  cVar2 = ctemplate::TemplateCache::ExpandWithData
                    ((TemplateString *)cache,(Strip)&local_50,
                     (TemplateDictionaryInterface *)CONCAT44(in_register_00000014,strip),
                     (PerExpandData *)dict,(ExpandEmitter *)per_expand_data);
  if ((bool)cVar2 == expected) {
    __dest = (char *)operator_new__(local_78 + 1);
    pcVar1 = local_80;
    strcpy(__dest,local_80);
    if (pcVar1 != local_70) {
      operator_delete(pcVar1);
    }
    return __dest;
  }
  printf("ASSERT FAILED, line %d: %s\n",0xba,
         "expected == cache->ExpandWithData(filename, strip, dict, per_expand_data, &outstring)");
  local_50 = (filename->_M_dataplus)._M_p;
  local_48 = filename->_M_string_length;
  local_40 = 0;
  local_38 = 0;
  local_60 = &PTR__ExpandEmitter_0011dcf8;
  local_58 = &local_80;
  cVar2 = ctemplate::TemplateCache::ExpandWithData
                    ((TemplateString *)cache,(Strip)&local_50,
                     (TemplateDictionaryInterface *)(ulong)strip,(PerExpandData *)dict,
                     (ExpandEmitter *)per_expand_data);
  if ((bool)cVar2 != expected) {
    __assert_fail("expected == cache->ExpandWithData(filename, strip, dict, per_expand_data, &outstring)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_test_util.cc"
                  ,0xba,
                  "const char *ctemplate::ExpandWithCacheIs(TemplateCache *, const string &, Strip, const TemplateDictionary *, PerExpandData *, bool)"
                 );
  }
  exit(1);
}

Assistant:

const char* ExpandWithCacheIs(TemplateCache* cache,
                              const string& filename, Strip strip,
                              const TemplateDictionary *dict,
                              PerExpandData* per_expand_data, bool expected) {
  string outstring;
  ASSERT(expected == cache->ExpandWithData(filename, strip, dict,
                                           per_expand_data, &outstring));


  char* buf = new char[outstring.size()+1];
  strcpy(buf, outstring.c_str());
  return buf;
}